

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Targa.cpp
# Opt level: O0

void __thiscall TargaImage::~TargaImage(TargaImage *this)

{
  TargaImage *this_local;
  
  ~TargaImage(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TargaImage::~TargaImage()
{
    if(pos > 0) flush();
    delete buffer;
    delete file;
}